

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O3

Employee * __thiscall Employee::operator=(Employee *this,Employee *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  Person::operator=(&this->super_Person,&e->super_Person);
  iVar1 = e->salaryPerHour;
  iVar2 = e->workToDo;
  iVar3 = e->workDone;
  this->hourWork = e->hourWork;
  this->salaryPerHour = iVar1;
  this->workToDo = iVar2;
  this->workDone = iVar3;
  return this;
}

Assistant:

Employee& Employee::operator=(const Employee &e) {
    Person::operator=(e);
    hourWork = e.hourWork;
    salaryPerHour = e.salaryPerHour;
    workToDo = e.workToDo;
    workDone = e.workDone;
    return *this;
}